

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySEQOutput.h
# Opt level: O2

void MySEQOutput::displayOffset(string *offsetName,DWORD offsetValue)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)offsetName);
  poVar1 = std::operator<<(poVar1,"=0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void displayOffset(std::string offsetName, DWORD offsetValue)
	{
		std::cout << offsetName << "=0x" << std::hex << offsetValue << std::endl;
	}